

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

void __thiscall ncnn::Yolov3DetectionOutput::Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  undefined8 *in_RDI;
  ParamDict pd;
  Layer *in_stack_fffffffffffff6d0;
  Mat *this_00;
  Allocator *in_stack_fffffffffffff710;
  
  Layer::Layer(in_stack_fffffffffffff6d0);
  *in_RDI = &PTR__Yolov3DetectionOutput_001e25a8;
  this_00 = (Mat *)(in_RDI + 0x19);
  Mat::Mat(this_00);
  Mat::Mat((Mat *)(in_RDI + 0x21));
  Mat::Mat((Mat *)(in_RDI + 0x29));
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff710);
  ParamDict::set((ParamDict *)&stack0xfffffffffffff6e8,0,0);
  ParamDict::~ParamDict((ParamDict *)this_00);
  return;
}

Assistant:

Yolov3DetectionOutput::Yolov3DetectionOutput()
{
    one_blob_only = false;
    support_inplace = false;
    
    //softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    //softmax->load_param(pd);
}